

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFromCord(Parser *this,Cord *input,Message *output)

{
  bool bVar1;
  undefined1 local_f0 [8];
  CordInputStream input_stream;
  Message *output_local;
  Cord *input_local;
  Parser *this_local;
  
  input_stream.available_ = (size_t)output;
  bVar1 = protobuf::(anonymous_namespace)::CheckParseInputSize<absl::lts_20250127::Cord_const>
                    (input,this->error_collector_);
  if (bVar1) {
    io::CordInputStream::CordInputStream((CordInputStream *)local_f0,input);
    this_local._7_1_ =
         Parse(this,(ZeroCopyInputStream *)local_f0,(Message *)input_stream.available_);
    io::CordInputStream::~CordInputStream((CordInputStream *)local_f0);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TextFormat::Parser::ParseFromCord(const absl::Cord& input,
                                       Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::CordInputStream input_stream(&input);
  return Parse(&input_stream, output);
}